

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  string *msg;
  long in_RDI;
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  WildcardPattern *in_stack_fffffffffffffee8;
  SourceLineInfo local_f0 [4];
  string local_a8 [32];
  string local_88 [48];
  undefined1 local_58 [87];
  byte local_1;
  
  switch(*(undefined4 *)(in_RDI + 0xc)) {
  case 0:
    normaliseString(in_stack_fffffffffffffee8,
                    (string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    local_1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string((string *)(local_58 + 0x20));
    break;
  case 1:
    normaliseString((WildcardPattern *)local_58,
                    (string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    local_1 = endsWith(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string((string *)local_58);
    break;
  case 2:
    normaliseString(in_stack_fffffffffffffee8,
                    (string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    local_1 = startsWith(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_88);
    break;
  case 3:
    normaliseString(in_stack_fffffffffffffee8,
                    (string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    local_1 = contains(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_a8);
    break;
  default:
    ReusableStringStream::ReusableStringStream
              ((ReusableStringStream *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0)
              );
    SourceLineInfo::SourceLineInfo
              (local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
               ,0x3c44);
    msg = (string *)
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffeb0,
                     (SourceLineInfo *)in_stack_fffffffffffffea8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffeb0,
               (char (*) [26])in_stack_fffffffffffffea8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffeb0,
               (char (*) [13])in_stack_fffffffffffffea8);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffea8);
    throw_logic_error(msg);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }